

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O2

int sha512_done(sha512_state *md,uchar *out)

{
  int iVar1;
  undefined8 in_RAX;
  ulong uVar2;
  
  iVar1 = (int)CONCAT71((int7)((ulong)in_RAX >> 8),md == (sha512_state *)0x0);
  if (out != (uchar *)0x0 && md != (sha512_state *)0x0) {
    uVar2 = md->curlen;
    if (uVar2 < 0x80) {
      md->length = md->length + uVar2 * 8;
      md->curlen = uVar2 + 1;
      md->buf[uVar2] = 0x80;
      uVar2 = md->curlen;
      if (0x70 < uVar2) {
        while (uVar2 < 0x80) {
          md->curlen = uVar2 + 1;
          md->buf[uVar2] = '\0';
          uVar2 = md->curlen;
        }
        s_sha512_compress(md,md->buf);
        md->curlen = 0;
        uVar2 = 0;
      }
      while (uVar2 < 0x78) {
        md->curlen = uVar2 + 1;
        md->buf[uVar2] = '\0';
        uVar2 = md->curlen;
      }
      uVar2 = md->length;
      *(ulong *)(md->buf + 0x78) =
           uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
           (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
           (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
      s_sha512_compress(md,md->buf);
      for (uVar2 = 0; uVar2 != 8; uVar2 = uVar2 + 1) {
        out[uVar2 * 8] = *(uchar *)((long)md->state + uVar2 * 8 + 7);
        out[uVar2 * 8 + 1] = *(uchar *)((long)md->state + uVar2 * 8 + 6);
        out[uVar2 * 8 + 2] = *(uchar *)((long)md->state + uVar2 * 8 + 5);
        out[uVar2 * 8 + 3] = *(uchar *)((long)md->state + uVar2 * 8 + 4);
        out[uVar2 * 8 + 4] = *(uchar *)((long)md->state + uVar2 * 8 + 3);
        out[uVar2 * 8 + 5] = *(uchar *)((long)md->state + uVar2 * 8 + 2);
        out[uVar2 * 8 + 6] = *(uchar *)((long)md->state + uVar2 * 8 + 1);
        out[uVar2 * 8 + 7] = (uchar)md->state[uVar2];
      }
    }
    iVar1 = (int)uVar2;
  }
  return iVar1;
}

Assistant:

static int sha512_done(struct sha512_state * md, unsigned char *out)
{
    int i;

    if (md == NULL) return -1;
    if (out == NULL) return -1;

    if (md->curlen >= sizeof(md->buf)) {
       return -1;
    }

    /* increase the length of the message */
    md->length += md->curlen * CONST64(8);

    /* append the '1' bit */
    md->buf[md->curlen++] = (unsigned char)0x80;

    /* if the length is currently above 112 bytes we append zeros
     * then compress.  Then we can fall back to padding zeros and length
     * encoding like normal.
     */
    if (md->curlen > 112) {
        while (md->curlen < 128) {
            md->buf[md->curlen++] = (unsigned char)0;
        }
        s_sha512_compress(md, md->buf);
        md->curlen = 0;
    }

    /* pad upto 120 bytes of zeroes
     * note: that from 112 to 120 is the 64 MSB of the length.  We assume that you won't hash
     * > 2^64 bits of data... :-)
     */
    while (md->curlen < 120) {
        md->buf[md->curlen++] = (unsigned char)0;
    }

    /* store length */
    STORE64H(md->length, md->buf+120);
    s_sha512_compress(md, md->buf);

    /* copy output */
    for (i = 0; i < 8; i++) {
        STORE64H(md->state[i], out+(8*i));
    }

    return 0;
}